

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O0

void * parse_TERM(SymbolContext<char> *ctx)

{
  int iVar1;
  Number *pNVar2;
  SymbolContext<char> *ctx_local;
  
  iVar1 = Centaurus::SymbolContext<char>::len(ctx);
  if (iVar1 == 1) {
    ctx_local = (SymbolContext<char> *)Centaurus::SymbolContext<char>::value<Number>(ctx,1);
  }
  else {
    ctx_local = (SymbolContext<char> *)operator_new(4);
    pNVar2 = Centaurus::SymbolContext<char>::value<Number>(ctx,1);
    iVar1 = pNVar2->num;
    pNVar2 = Centaurus::SymbolContext<char>::value<Number>(ctx,2);
    Number::Number((Number *)ctx_local,iVar1 * pNVar2->num);
  }
  return ctx_local;
}

Assistant:

void *parse_TERM(const SymbolContext<char>& ctx)
{
    if (ctx.len() == 1)
        return ctx.value<Number>(1);
    else
        return new Number{ctx.value<Number>(1)->num * ctx.value<Number>(2)->num};
}